

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

bool __thiscall FScanner::GetToken(FScanner *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  char *local_30;
  char *stopper_1;
  char *stopper;
  FScanner *local_18;
  FScanner *this_local;
  
  local_18 = this;
  bVar1 = ScanString(this,true);
  if (bVar1) {
    if (this->TokenType == 0x103) {
      FName::FName((FName *)((long)&stopper + 4),this->String);
      FName::operator=(&this->Name,(FName *)((long)&stopper + 4));
    }
    else if (this->TokenType == 0x104) {
      if ((((this->String[this->StringLen + -1] == 'u') ||
           (this->String[this->StringLen + -1] == 'U')) ||
          (this->String[this->StringLen + -2] == 'u')) ||
         (this->String[this->StringLen + -2] == 'U')) {
        this->TokenType = 0x105;
        uVar3 = strtoul(this->String,&stopper_1,0);
        this->Number = (int)uVar3;
        this->Float = (double)(uint)this->Number;
      }
      else {
        lVar4 = strtol(this->String,&stopper_1,0);
        this->Number = (int)lVar4;
        this->Float = (double)this->Number;
      }
    }
    else if (this->TokenType == 0x106) {
      dVar5 = strtod(this->String,&local_30);
      this->Float = dVar5;
    }
    else if (this->TokenType == 0x102) {
      iVar2 = strbin(this->String);
      this->StringLen = iVar2;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FScanner::GetToken ()
{
	if (ScanString (true))
	{
		if (TokenType == TK_NameConst)
		{
			Name = FName(String);
		}
		else if (TokenType == TK_IntConst)
		{
			char *stopper;
			// Check for unsigned
			if (String[StringLen - 1] == 'u' || String[StringLen - 1] == 'U' ||
				String[StringLen - 2] == 'u' || String[StringLen - 2] == 'U')
			{
				TokenType = TK_UIntConst;
				Number = strtoul(String, &stopper, 0);
				Float = (unsigned)Number;
			}
			else
			{
				Number = strtol(String, &stopper, 0);
				Float = Number;
			}
		}
		else if (TokenType == TK_FloatConst)
		{
			char *stopper;
			Float = strtod(String, &stopper);
		}
		else if (TokenType == TK_StringConst)
		{
			StringLen = strbin(String);
		}
		return true;
	}
	return false;
}